

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O1

void __thiscall
ConfidentialTxOut_Constractor2_Test::TestBody(ConfidentialTxOut_Constractor2_Test *this)

{
  bool *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 auVar3 [8];
  _func_int **pp_Var4;
  bool bVar5;
  pointer puVar6;
  pointer pcVar7;
  ulong uVar8;
  size_t sVar9;
  char *pcVar10;
  Amount AVar11;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_8;
  ConfidentialTxOutReference txout_ref;
  ConfidentialTxOut txout;
  undefined1 local_2b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  undefined1 local_290 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  undefined *local_280 [5];
  string local_258;
  int local_230 [2];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  ConfidentialTxOutReference local_220;
  ConfidentialTxOut local_128;
  
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            (&local_128,&exp_script,&exp_asset,&exp_value,&exp_nonce,&exp_surjection_proof,
             &exp_range_proof);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&local_220,&local_128.asset_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)local_290,(ConfidentialAssetId *)&local_220);
  auVar3 = local_290;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_2b8,&exp_asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()"
             ,(char *)auVar3,(char *)local_2b8);
  if (local_2b8 != (undefined1  [8])&local_2a8) {
    operator_delete((void *)local_2b8);
  }
  if (local_290 != (undefined1  [8])local_280) {
    operator_delete((void *)local_290);
  }
  local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__ConfidentialAssetId_006a21d8;
  if ((long *)local_220.super_AbstractTxOutReference.value_.amount_ != (long *)0x0) {
    operator_delete((void *)local_220.super_AbstractTxOutReference.value_.amount_);
  }
  if ((char)local_258._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_220);
    if ((undefined8 *)local_258._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_258._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x5f,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_290,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_290);
    if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
      local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&local_220,&local_128.confidential_value_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)local_290,(ConfidentialValue *)&local_220);
  auVar3 = local_290;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_2b8,&exp_value);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetConfidentialValue().GetHex().c_str()",
             "exp_value.GetHex().c_str()",(char *)auVar3,(char *)local_2b8);
  if (local_2b8 != (undefined1  [8])&local_2a8) {
    operator_delete((void *)local_2b8);
  }
  if (local_290 != (undefined1  [8])local_280) {
    operator_delete((void *)local_290);
  }
  local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__ConfidentialValue_006a2070;
  if ((long *)local_220.super_AbstractTxOutReference.value_.amount_ != (long *)0x0) {
    operator_delete((void *)local_220.super_AbstractTxOutReference.value_.amount_);
  }
  if ((char)local_258._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_220);
    if ((undefined8 *)local_258._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_258._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x61,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_290,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_290);
    if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
      local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)&local_220,&local_128.super_AbstractTxOut);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_290,(Script *)&local_220);
  auVar3 = local_290;
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_2b8,&exp_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetLockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",(char *)auVar3,(char *)local_2b8);
  if (local_2b8 != (undefined1  [8])&local_2a8) {
    operator_delete((void *)local_2b8);
  }
  if (local_290 != (undefined1  [8])local_280) {
    operator_delete((void *)local_290);
  }
  cfd::core::Script::~Script((Script *)&local_220);
  if ((char)local_258._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_220);
    if ((undefined8 *)local_258._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_258._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,99,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_290,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_290);
    if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
      local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&local_220,&local_128.nonce_)
  ;
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)local_290,(ConfidentialNonce *)&local_220);
  auVar3 = local_290;
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_((string *)local_2b8,&exp_nonce);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetNonce().GetHex().c_str()","exp_nonce.GetHex().c_str()"
             ,(char *)auVar3,(char *)local_2b8);
  if (local_2b8 != (undefined1  [8])&local_2a8) {
    operator_delete((void *)local_2b8);
  }
  if (local_290 != (undefined1  [8])local_280) {
    operator_delete((void *)local_290);
  }
  local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__ConfidentialNonce_006a23c0;
  if ((long *)local_220.super_AbstractTxOutReference.value_.amount_ != (long *)0x0) {
    operator_delete((void *)local_220.super_AbstractTxOutReference.value_.amount_);
  }
  if ((char)local_258._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_220);
    if ((undefined8 *)local_258._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_258._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,100,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_290,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_290);
    if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
      local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2b8 = (undefined1  [8])0x0;
  sStack_2b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2a8._M_allocated_capacity = 0;
  uVar8 = (long)local_128.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_128.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    puVar6 = (pointer)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    puVar6 = (pointer)operator_new(uVar8);
  }
  local_2a8._M_allocated_capacity = (size_type)(puVar6 + uVar8);
  sVar9 = (long)local_128.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_128.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_2b8 = (undefined1  [8])puVar6;
  if (sVar9 != 0) {
    sStack_2b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar6;
    memmove(puVar6,local_128.range_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  sStack_2b0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar6 + sVar9);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_220,(ByteData *)local_2b8);
  pp_Var4 = local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_290,&exp_range_proof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetRangeProof().GetHex().c_str()",
             "exp_range_proof.GetHex().c_str()",(char *)pp_Var4,(char *)local_290);
  if (local_290 != (undefined1  [8])local_280) {
    operator_delete((void *)local_290);
  }
  pbVar1 = &local_220.super_AbstractTxOutReference.value_.ignore_check_;
  if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)pbVar1) {
    operator_delete(local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference);
  }
  if (local_2b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2b8);
  }
  if ((char)local_258._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_220);
    if ((undefined8 *)local_258._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_258._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x66,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_290,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_290);
    if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
      local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2b8 = (undefined1  [8])0x0;
  sStack_2b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2a8._M_allocated_capacity = 0;
  uVar8 = (long)local_128.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_128.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    puVar6 = (pointer)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    puVar6 = (pointer)operator_new(uVar8);
  }
  local_2a8._M_allocated_capacity = (size_type)(puVar6 + uVar8);
  sVar9 = (long)local_128.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_128.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_2b8 = (undefined1  [8])puVar6;
  if (sVar9 != 0) {
    sStack_2b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar6;
    memmove(puVar6,local_128.surjection_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  sStack_2b0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar6 + sVar9);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_220,(ByteData *)local_2b8);
  pp_Var4 = local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_290,&exp_surjection_proof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetSurjectionProof().GetHex().c_str()",
             "exp_surjection_proof.GetHex().c_str()",(char *)pp_Var4,(char *)local_290);
  if (local_290 != (undefined1  [8])local_280) {
    operator_delete((void *)local_290);
  }
  if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)pbVar1) {
    operator_delete(local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference);
  }
  if (local_2b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2b8);
  }
  if ((char)local_258._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_220);
    if ((undefined8 *)local_258._M_string_length == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_258._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x68,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_290,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_290);
    if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
      local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  AVar11 = cfd::core::AbstractTxOut::GetValue(&local_128.super_AbstractTxOut);
  local_290 = (undefined1  [8])AVar11.amount_;
  local_288.ptr_._0_1_ = AVar11.ignore_check_;
  local_2b8 = (undefined1  [8])cfd::core::Amount::GetSatoshiValue((Amount *)local_290);
  local_258._M_dataplus._M_p = (pointer)((ulong)local_258._M_dataplus._M_p._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&local_220,"txout.GetValue().GetSatoshiValue()","0",(long *)local_2b8,
             (int *)&local_258);
  if ((char)local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference == '\0') {
    testing::Message::Message((Message *)local_290);
    if ((long *)local_220.super_AbstractTxOutReference.value_.amount_ == (long *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_220.super_AbstractTxOutReference.value_.amount_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x69,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
    if (local_290 != (undefined1  [8])0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && (local_290 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_290 + 8))();
      }
      local_290 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_220.super_AbstractTxOutReference.value_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxOut::GetWitnessHash((ByteData256 *)local_290,&local_128);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&local_220,(ByteData256 *)local_290);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b8,"txout.GetWitnessHash().GetHex().c_str()",
             "\"51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093\"",
             (char *)local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference,
             "51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093");
  if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)pbVar1) {
    operator_delete(local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference);
  }
  if (local_290 != (undefined1  [8])0x0) {
    operator_delete((void *)local_290);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_220);
    if (sStack_2b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)sStack_2b0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x6b,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_290,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_290);
    if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
      local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference(&local_220,&local_128);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_290,&local_220.asset_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)local_2b8,(ConfidentialAssetId *)local_290);
  auVar3 = local_2b8;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_258,&exp_asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetAsset().GetHex().c_str()",
             "exp_asset.GetHex().c_str()",(char *)auVar3,local_258._M_dataplus._M_p);
  paVar2 = &local_258.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if (local_2b8 != (undefined1  [8])&local_2a8) {
    operator_delete((void *)local_2b8);
  }
  local_290 = (undefined1  [8])&PTR__ConfidentialAssetId_006a21d8;
  if ((void *)CONCAT71(local_288.ptr_._1_7_,local_288.ptr_._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_288.ptr_._1_7_,local_288.ptr_._0_1_));
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x6f,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
    if (local_290 != (undefined1  [8])0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && (local_290 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_290 + 8))();
      }
      local_290 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_290,&local_220.confidential_value_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)local_2b8,(ConfidentialValue *)local_290);
  auVar3 = local_2b8;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_258,&exp_value);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "exp_value.GetHex().c_str()",(char *)auVar3,local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if (local_2b8 != (undefined1  [8])&local_2a8) {
    operator_delete((void *)local_2b8);
  }
  local_290 = (undefined1  [8])&PTR__ConfidentialValue_006a2070;
  if ((void *)CONCAT71(local_288.ptr_._1_7_,local_288.ptr_._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_288.ptr_._1_7_,local_288.ptr_._0_1_));
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x71,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
    if (local_290 != (undefined1  [8])0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && (local_290 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_290 + 8))();
      }
      local_290 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script
            ((Script *)local_290,&local_220.super_AbstractTxOutReference.locking_script_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_2b8,(Script *)local_290);
  auVar3 = local_2b8;
  cfd::core::Script::GetHex_abi_cxx11_(&local_258,&exp_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetLockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",(char *)auVar3,local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if (local_2b8 != (undefined1  [8])&local_2a8) {
    operator_delete((void *)local_2b8);
  }
  cfd::core::Script::~Script((Script *)local_290);
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x73,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
    if (local_290 != (undefined1  [8])0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && (local_290 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_290 + 8))();
      }
      local_290 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_290,&local_220.nonce_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)local_2b8,(ConfidentialNonce *)local_290);
  auVar3 = local_2b8;
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_(&local_258,&exp_nonce);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetNonce().GetHex().c_str()",
             "exp_nonce.GetHex().c_str()",(char *)auVar3,local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if (local_2b8 != (undefined1  [8])&local_2a8) {
    operator_delete((void *)local_2b8);
  }
  local_290 = (undefined1  [8])&PTR__ConfidentialNonce_006a23c0;
  if ((void *)CONCAT71(local_288.ptr_._1_7_,local_288.ptr_._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_288.ptr_._1_7_,local_288.ptr_._0_1_));
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x75,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
    if (local_290 != (undefined1  [8])0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && (local_290 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_290 + 8))();
      }
      local_290 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_258._M_dataplus._M_p = (pointer)0x0;
  local_258._M_string_length = 0;
  local_258.field_2._M_allocated_capacity = 0;
  uVar8 = (long)local_220.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_220.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pcVar7 = (pointer)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar7 = (pointer)operator_new(uVar8);
  }
  local_258.field_2._M_allocated_capacity = (size_type)(pcVar7 + uVar8);
  sVar9 = (long)local_220.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_220.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_258._M_dataplus._M_p = pcVar7;
  if (sVar9 != 0) {
    local_258._M_string_length = (size_type)pcVar7;
    memmove(pcVar7,local_220.range_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  local_258._M_string_length = (size_type)(pcVar7 + sVar9);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_290,(ByteData *)&local_258);
  auVar3 = local_290;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_2b8,&exp_range_proof);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetRangeProof().GetHex().c_str()",
             "exp_range_proof.GetHex().c_str()",(char *)auVar3,(char *)local_2b8);
  if (local_2b8 != (undefined1  [8])&local_2a8) {
    operator_delete((void *)local_2b8);
  }
  if (local_290 != (undefined1  [8])local_280) {
    operator_delete((void *)local_290);
  }
  if (local_258._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x77,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
    if (local_290 != (undefined1  [8])0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && (local_290 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_290 + 8))();
      }
      local_290 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_258._M_dataplus._M_p = (pointer)0x0;
  local_258._M_string_length = 0;
  local_258.field_2._M_allocated_capacity = 0;
  uVar8 = (long)local_220.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_220.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pcVar7 = (pointer)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar7 = (pointer)operator_new(uVar8);
  }
  local_258.field_2._M_allocated_capacity = (size_type)(pcVar7 + uVar8);
  sVar9 = (long)local_220.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_220.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_258._M_dataplus._M_p = pcVar7;
  if (sVar9 != 0) {
    local_258._M_string_length = (size_type)pcVar7;
    memmove(pcVar7,local_220.surjection_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  local_258._M_string_length = (size_type)(pcVar7 + sVar9);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_290,(ByteData *)&local_258);
  auVar3 = local_290;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_2b8,&exp_surjection_proof);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetSurjectionProof().GetHex().c_str()",
             "exp_surjection_proof.GetHex().c_str()",(char *)auVar3,(char *)local_2b8);
  if (local_2b8 != (undefined1  [8])&local_2a8) {
    operator_delete((void *)local_2b8);
  }
  if (local_290 != (undefined1  [8])local_280) {
    operator_delete((void *)local_290);
  }
  if (local_258._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x79,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
    if (local_290 != (undefined1  [8])0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && (local_290 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_290 + 8))();
      }
      local_290 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2b8 = (undefined1  [8])local_220.super_AbstractTxOutReference.value_.amount_;
  sStack_2b0.ptr_._0_1_ = local_220.super_AbstractTxOutReference.value_.ignore_check_;
  local_258._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue((Amount *)local_2b8);
  local_230[0] = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_290,"txout_ref.GetValue().GetSatoshiValue()","0",(long *)&local_258,
             local_230);
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if ((undefined8 *)CONCAT71(local_288.ptr_._1_7_,local_288.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)CONCAT71(local_288.ptr_._1_7_,local_288.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x7a,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_2b8 != (undefined1  [8])0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && (local_2b8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_2b8 + 8))();
      }
      local_2b8 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_288,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_220);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_128);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Constractor2) {
  // Script, ConfidentialAssetId, ConfidentialValue, ConfidentialNonce, ByteData, ByteData
  ConfidentialTxOut txout(exp_script, exp_asset, exp_value, exp_nonce,
                          exp_surjection_proof, exp_range_proof);
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093");

  ConfidentialTxOutReference txout_ref(txout);
  EXPECT_STREQ(txout_ref.GetAsset().GetHex().c_str(),
               exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(),
               exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), 0);
}